

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool validate_integral_image_int
               (_func_void_uint8_t_ptr_integral_image_ptr *original_function,
               vector<void_(*)(unsigned_char_*,_integral_image_*),_std::allocator<void_(*)(unsigned_char_*,_integral_image_*)>_>
               *test_functions,int width,int height,uint8_t *image,bool is_padded)

{
  bool bVar1;
  bool bVar2;
  integral_image *__ptr;
  integral_image *__ptr_00;
  int j;
  ulong uVar3;
  undefined3 in_register_00000089;
  
  if (CONCAT31(in_register_00000089,is_padded) == 0) {
    __ptr = create_integral_img(width,height);
  }
  else {
    __ptr = create_padded_integral_img(width,height);
  }
  (*original_function)(image,__ptr);
  bVar1 = true;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(test_functions->
                            super__Vector_base<void_(*)(unsigned_char_*,_integral_image_*),_std::allocator<void_(*)(unsigned_char_*,_integral_image_*)>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(test_functions->
                            super__Vector_base<void_(*)(unsigned_char_*,_integral_image_*),_std::allocator<void_(*)(unsigned_char_*,_integral_image_*)>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    if (is_padded) {
      __ptr_00 = create_padded_integral_img(width,height);
    }
    else {
      __ptr_00 = create_integral_img(width,height);
    }
    (*(test_functions->
      super__Vector_base<void_(*)(unsigned_char_*,_integral_image_*),_std::allocator<void_(*)(unsigned_char_*,_integral_image_*)>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar3])(image,__ptr_00);
    bVar2 = are_float_matrices_equal
                      (__ptr->padded_data,__ptr_00->padded_data,__ptr->data_width,__ptr->data_height
                      );
    if (!bVar2) {
      bVar1 = false;
      printf("Error: compute_integral_img_int() test function %d does not match original function.\n"
             ,uVar3 & 0xffffffff);
    }
    free(__ptr_00->padded_data);
    free(__ptr_00);
  }
  free(__ptr->padded_data);
  free(__ptr);
  return bVar1;
}

Assistant:

bool validate_integral_image_int(void (*original_function)(uint8_t *, struct integral_image *),
                                 const std::vector<void (*)(uint8_t *, struct integral_image *)> &test_functions, int width,
                                 int height, uint8_t *image, bool is_padded) {
   
    // Checking if original integral image should be padded and initializing it   
    struct integral_image *original_iimage;
    if (!is_padded) {
        original_iimage = create_integral_img(width, height);
    } else {
        original_iimage = create_padded_integral_img(width, height);
    }

    // Compute original integral image
    original_function(image, original_iimage);

    bool all_functions_equal = true;

    // Iterating through all test functions
    for (int j = 0; j < test_functions.size(); ++j) {

        // Checking if original integral image should be padded and initializing it   
        struct integral_image *optimized_iimage;
        if (!is_padded) {
            optimized_iimage = create_integral_img(width, height);
        } else {
            optimized_iimage = create_padded_integral_img(width, height);
        }       

        // Compute integral image
        test_functions[j](image, optimized_iimage);

        if (!are_float_matrices_equal(original_iimage->padded_data, 
                                      optimized_iimage->padded_data, 
                                      original_iimage->data_width, 
                                      original_iimage->data_height)) {
            all_functions_equal = false;
            printf("Error: compute_integral_img_int() test function %d does not match original function.\n", j);
        }

        free(optimized_iimage->padded_data);
        free(optimized_iimage);
    }

    free(original_iimage->padded_data);
    free(original_iimage);

    return all_functions_equal;

}